

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job.cpp
# Opt level: O0

string * __thiscall
ot::commissioner::Job::GetCommandString_abi_cxx11_(string *__return_storage_ptr__,Job *this)

{
  string local_1f0 [32];
  ostringstream *local_1d0;
  ostringstream *local_1b8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a0;
  undefined1 local_191;
  ostringstream local_190 [8];
  ostringstream command;
  Job *this_local;
  string *out;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  local_191 = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_1a0._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&this->mExpr);
  local_1b0._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&this->mExpr);
  local_1a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator-(&local_1b0,1);
  local_1b8 = (ostringstream *)local_190;
  local_1d0 = (ostringstream *)
              std::
              for_each<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,ot::commissioner::Job::GetCommandString()::__0>
                        (local_1a0,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )local_1a8,(ostringstream *)local_190);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_1f0);
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::string::pop_back();
  local_191 = 1;
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string Job::GetCommandString()
{
    std::ostringstream command;
    std::string        out;

    for_each(mExpr.begin(), mExpr.end() - 1, [&command](std::string &item) { command << item << " "; });
    out = command.str();
    out.pop_back(); // get rid of trailing space
    return out;
}